

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabel::setPixmap(QLabel *this,QPixmap *pixmap)

{
  bool bVar1;
  QLabelPrivate *pQVar2;
  QIcon *pQVar3;
  QSizeF *pQVar4;
  QSize QVar5;
  QPixmap *in_RSI;
  QLabelPrivate *in_RDI;
  long in_FS_OFFSET;
  QLabelPrivate *d;
  QSize *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  QIcon *in_stack_ffffffffffffff68;
  QSizeF *in_stack_ffffffffffffff70;
  undefined5 in_stack_ffffffffffffff78;
  byte bVar6;
  undefined1 uVar7;
  byte bVar8;
  byte bVar9;
  QIcon local_50;
  undefined8 local_48;
  QPixmap local_40 [24];
  undefined8 local_28;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QLabel *)0x5ae490);
  bVar1 = std::optional::operator_cast_to_bool((optional<QIcon> *)0x5ae4a6);
  bVar9 = 0;
  bVar8 = 0;
  bVar6 = false;
  if (bVar1) {
    pQVar3 = std::optional<QIcon>::operator->((optional<QIcon> *)0x5ae4d3);
    QIcon::availableSizes((Mode)local_20,(State)pQVar3);
    bVar9 = 1;
    local_28 = QPixmap::size();
    bVar1 = QListSpecialMethodsBase<QSize>::contains<QSize>
                      ((QListSpecialMethodsBase<QSize> *)
                       CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    bVar6 = false;
    if (bVar1) {
      in_stack_ffffffffffffff68 = std::optional<QIcon>::operator->((optional<QIcon> *)0x5ae536);
      local_48 = QPixmap::size();
      QIcon::pixmap((QSize *)local_40,(Mode)in_stack_ffffffffffffff68,(State)&local_48);
      bVar8 = 1;
      in_stack_ffffffffffffff70 = (QSizeF *)QPixmap::cacheKey();
      pQVar4 = (QSizeF *)QPixmap::cacheKey();
      bVar6 = in_stack_ffffffffffffff70 == pQVar4;
    }
  }
  uVar7 = bVar6;
  if ((bVar8 & 1) != 0) {
    QPixmap::~QPixmap(local_40);
  }
  if ((bVar9 & 1) != 0) {
    QList<QSize>::~QList((QList<QSize> *)0x5ae5c7);
  }
  if ((bVar6 & 1) == 0) {
    QLabelPrivate::clearContents(in_RDI);
    QIcon::QIcon(&local_50,in_RSI);
    std::optional<QIcon>::operator=
              ((optional<QIcon> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QIcon::~QIcon(&local_50);
    QPixmap::deviceIndependentSize();
    QVar5 = QSizeF::toSize(in_stack_ffffffffffffff70);
    pQVar2->pixmapSize = QVar5;
    QLabelPrivate::updateLabel
              ((QLabelPrivate *)
               CONCAT17(bVar9,CONCAT16(bVar8,CONCAT15(uVar7,in_stack_ffffffffffffff78))));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabel::setPixmap(const QPixmap &pixmap)
{
    Q_D(QLabel);
    if (d->icon && d->icon->availableSizes().contains(pixmap.size()) &&
        d->icon->pixmap(pixmap.size()).cacheKey() == pixmap.cacheKey())
        return;
    d->clearContents();
    d->icon = QIcon(pixmap);
    d->pixmapSize = pixmap.deviceIndependentSize().toSize();
    d->updateLabel();
}